

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

Reference * __thiscall
mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprPrinter>::
ReadReference_abi_cxx11_
          (Reference *__return_storage_ptr__,
          NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprPrinter> *this)

{
  BinaryReaderBase *this_00;
  char *pcVar1;
  undefined8 local_38;
  undefined8 uStack_30;
  ArgList local_20;
  
  this_00 = *(BinaryReaderBase **)this;
  pcVar1 = (this_00->super_ReaderBase).ptr_;
  (this_00->super_ReaderBase).token_ = pcVar1;
  (this_00->super_ReaderBase).ptr_ = pcVar1 + 1;
  if (*pcVar1 != 'v') {
    local_38 = 0;
    uStack_30 = 0;
    local_20.types_ = 0;
    local_20.field_1.values_ = (Value *)&local_38;
    BinaryReaderBase::ReportError(this_00,(CStringRef)0x139f8a,&local_20);
  }
  DoReadReference_abi_cxx11_(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

Reference ReadReference() {
    if (reader_.ReadChar() != 'v')
      reader_.ReportError("expected reference");
    return DoReadReference();
  }